

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall
soplex::SPxBasisBase<double>::load
          (SPxBasisBase<double> *this,SPxSolverBase<double> *lp,bool initSlackBasis)

{
  byte in_DL;
  SPxSolverBase<double> *in_RSI;
  SPxBasisBase<double> *in_RDI;
  
  in_RDI->theLP = in_RSI;
  setOutstream(in_RDI,in_RDI->theLP->spxout);
  setRep(in_RDI);
  if ((in_DL & 1) != 0) {
    restoreInitialBasis(this);
    (*in_RDI->_vptr_SPxBasisBase[5])(in_RDI,&in_RDI->thedesc);
  }
  return;
}

Assistant:

void SPxBasisBase<R>::load(SPxSolverBase<R>* lp, bool initSlackBasis)
{
   assert(lp != nullptr);
   theLP = lp;

   setOutstream(*theLP->spxout);

   setRep();

   if(initSlackBasis)
   {
      restoreInitialBasis();
      loadDesc(thedesc);
   }
}